

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

Builder * __thiscall
capnp::anon_unknown_0::MembraneCapTableBuilder::imbue
          (Builder *__return_storage_ptr__,MembraneCapTableBuilder *this,Builder builder)

{
  CapTableBuilder *pCVar1;
  Fault f;
  PointerBuilder pointerBuilder;
  
  pointerBuilder.segment = (SegmentBuilder *)&this->inner;
  pointerBuilder.capTable = (CapTableBuilder *)0x0;
  pointerBuilder.pointer = (WirePointer *)anon_var_dwarf_3d166;
  if (this->inner == (CapTableBuilder *)0x0) {
    pointerBuilder.pointer = builder.builder.pointer;
    pointerBuilder.segment = builder.builder.segment;
    pointerBuilder.capTable = builder.builder.capTable;
    pCVar1 = capnp::_::PointerBuilder::getCapTable(&pointerBuilder);
    this->inner = pCVar1;
    capnp::_::PointerBuilder::imbue
              (&__return_storage_ptr__->builder,&pointerBuilder,&this->super_CapTableBuilder);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::CapTableBuilder*&,decltype(nullptr)>&,char_const(&)[24]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
             ,0x52,FAILED,"inner == nullptr","_kjCondition,\"can only call this once\"",
             (DebugComparison<capnp::_::CapTableBuilder_*&,_std::nullptr_t> *)&pointerBuilder,
             (char (*) [24])"can only call this once");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

AnyPointer::Builder imbue(AnyPointer::Builder builder) {
    KJ_REQUIRE(inner == nullptr, "can only call this once");
    auto pointerBuilder = _::PointerHelpers<AnyPointer>::getInternalBuilder(kj::mv(builder));
    inner = pointerBuilder.getCapTable();
    return AnyPointer::Builder(pointerBuilder.imbue(this));
  }